

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall exe_reconstructor::sectioninfo::copydata(sectioninfo *this,ReadWriter_ptr *w)

{
  pointer puVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  reference pvVar4;
  size_type sVar5;
  undefined4 extraout_var_00;
  size_t n;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  ByteVector buf;
  uint64_t pos;
  ReadWriter_ptr *w_local;
  sectioninfo *this_local;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->r);
  (*peVar3->_vptr_ReadWriter[4])(peVar3,0);
  while( true ) {
    puVar1 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->r);
    iVar2 = (*peVar3->_vptr_ReadWriter[6])();
    if ((pointer)CONCAT44(extraout_var,iVar2) <= puVar1) break;
    std::allocator<unsigned_char>::allocator(&local_39);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x10000,&local_39);
    std::allocator<unsigned_char>::~allocator(&local_39);
    peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->r);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    iVar2 = (*peVar3->_vptr_ReadWriter[2])(peVar3,pvVar4,sVar5);
    peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )w);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
    (*peVar3->_vptr_ReadWriter[3])(peVar3,pvVar4,CONCAT44(extraout_var_00,iVar2));
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + CONCAT44(extraout_var_00,iVar2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  }
  return;
}

Assistant:

void copydata(ReadWriter_ptr w)
        {
            uint64_t pos= 0;
            r->setpos(0);
            while (pos < r->size()) {
                ByteVector buf(65536);
                size_t n= r->read(&buf[0], buf.size());
                w->write(&buf[0], n);
                pos += n;
            }
        }